

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.h
# Opt level: O0

void __thiscall
sc_core::sc_signal_t<bool,_(sc_core::sc_writer_policy)1>::dump
          (sc_signal_t<bool,_(sc_core::sc_writer_policy)1> *this,ostream *os)

{
  ostream *poVar1;
  char *pcVar2;
  void *pvVar3;
  ostream *in_RSI;
  long in_RDI;
  
  poVar1 = std::operator<<(in_RSI,"     name = ");
  pcVar2 = sc_object::name((sc_object *)0x2313cc);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"    value = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar1,(bool)(*(byte *)(in_RDI + 0xb0) & 1));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"new value = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar1,(bool)(*(byte *)(in_RDI + 0xb1) & 1));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
sc_signal_t<T,POL>::dump( ::std::ostream& os ) const
{
    os << "     name = " << name() << ::std::endl;
    os << "    value = " << m_cur_val << ::std::endl;
    os << "new value = " << m_new_val << ::std::endl;
}